

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O2

Matrix3d * ins_ekf::RPYToRotMat(Matrix3d *__return_storage_ptr__,Vector3d *rpy)

{
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_30;
  
  dVar2 = cos((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0]);
  dVar3 = sin((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0]);
  dVar4 = cos((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1]);
  dVar5 = sin((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1]);
  dVar6 = cos((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2]);
  dVar7 = sin((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2]);
  local_30.m_row = 0;
  local_30.m_col = 1;
  local_30.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = dVar4 * dVar6;
  local_38 = dVar4 * dVar7;
  local_30.m_xpr = __return_storage_ptr__;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_30,&local_38);
  local_40 = -dVar5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_40);
  local_48 = dVar3 * dVar5 * dVar6 - dVar7 * dVar2;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_48);
  local_50 = dVar3 * dVar5 * dVar7 + dVar2 * dVar6;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_50);
  local_58 = dVar3 * dVar4;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_58);
  local_60 = dVar5 * dVar2 * dVar6 + dVar3 * dVar7;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_60);
  local_68 = dVar5 * dVar2 * dVar7 - dVar6 * dVar3;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_68);
  local_70 = dVar2 * dVar4;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_70);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d RPYToRotMat(const Eigen::Vector3d& rpy){

        Eigen::Matrix3d rot_I_to_B; // inertial frame to body frame
        double cr   = cos(rpy[0]);
        double sr   = sin(rpy[0]);
        double cp   = cos(rpy[1]);
        double sp   = sin(rpy[1]);
        double cy   = cos(rpy[2]);
        double sy   = sin(rpy[2]);

        rot_I_to_B << cp*cy, cp*sy, -sp,
                sr*sp*cy - cr*sy, sr*sp*sy + cr*cy, sr*cp,
                cr*sp*cy + sr*sy, cr*sp*sy - sr*cy, cr*cp;

        return rot_I_to_B;
    }